

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint postProcessScanlines(uchar *out,uchar *in,uint w,uint h,LodePNGInfo *info_png)

{
  uint uVar1;
  uint in_ECX;
  uint in_EDX;
  long in_R8;
  uint in_stack_0000000c;
  uint in_stack_00000010;
  uint in_stack_00000014;
  uint error_2;
  uint i;
  size_t passstart [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  uint passh [7];
  uint passw [7];
  uint error_1;
  uint error;
  uint bpp;
  int local_13c;
  size_t local_138;
  uint in_stack_fffffffffffffed4;
  uint in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  uchar *in_stack_fffffffffffffee0;
  uchar *in_stack_fffffffffffffee8;
  uchar *in_stack_fffffffffffffef0;
  size_t local_f8 [8];
  size_t local_b8 [8];
  uint local_78 [8];
  uint local_58 [10];
  uint local_30;
  uint local_2c;
  long local_28;
  uint local_20;
  uint local_1c;
  
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_2c = lodepng_get_bpp((LodePNGColorMode *)0x5e532e);
  if (local_2c == 0) {
    return 0x1f;
  }
  if (*(int *)(local_28 + 8) == 0) {
    if ((local_2c < 8) && (local_1c * local_2c != (local_1c * local_2c + 7 & 0xfffffff8))) {
      local_30 = unfilter(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                          in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                          in_stack_fffffffffffffed4);
      if (local_30 != 0) {
        return local_30;
      }
      removePaddingBits(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                        (size_t)in_stack_fffffffffffffee0,
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        in_stack_fffffffffffffed4);
    }
    else {
      uVar1 = unfilter(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc
                       ,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
      if (uVar1 != 0) {
        return uVar1;
      }
    }
  }
  else {
    Adam7_getpassvalues(local_58,local_78,local_b8,local_f8,&local_138,local_1c,local_20,local_2c);
    for (local_13c = 0; local_13c != 7; local_13c = local_13c + 1) {
      uVar1 = unfilter(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc
                       ,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
      if (uVar1 != 0) {
        return uVar1;
      }
      if (local_2c < 8) {
        removePaddingBits(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                          (size_t)in_stack_fffffffffffffee0,
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          in_stack_fffffffffffffed4);
      }
    }
    Adam7_deinterlace((uchar *)passstart[0],_error_2,in_stack_00000014,in_stack_00000010,
                      in_stack_0000000c);
  }
  return 0;
}

Assistant:

static unsigned postProcessScanlines(unsigned char* out, unsigned char* in,
                                     unsigned w, unsigned h, const LodePNGInfo* info_png)
{
  /*
  This function converts the filtered-padded-interlaced data into pure 2D image buffer with the PNG's colortype.
  Steps:
  *) if no Adam7: 1) unfilter 2) remove padding bits (= posible extra bits per scanline if bpp < 8)
  *) if adam7: 1) 7x unfilter 2) 7x remove padding bits 3) Adam7_deinterlace
  NOTE: the in buffer will be overwritten with intermediate data!
  */
  unsigned bpp = lodepng_get_bpp(&info_png->color);
  if(bpp == 0) return 31; /*error: invalid colortype*/

  if(info_png->interlace_method == 0)
  {
    if(bpp < 8 && w * bpp != ((w * bpp + 7) / 8) * 8)
    {
      CERROR_TRY_RETURN(unfilter(in, in, w, h, bpp));
      removePaddingBits(out, in, w * bpp, ((w * bpp + 7) / 8) * 8, h);
    }
    /*we can immediately filter into the out buffer, no other steps needed*/
    else CERROR_TRY_RETURN(unfilter(out, in, w, h, bpp));
  }
  else /*interlace_method is 1 (Adam7)*/
  {
    unsigned passw[7], passh[7]; size_t filter_passstart[8], padded_passstart[8], passstart[8];
    unsigned i;

    Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, bpp);

    for(i = 0; i != 7; ++i)
    {
      CERROR_TRY_RETURN(unfilter(&in[padded_passstart[i]], &in[filter_passstart[i]], passw[i], passh[i], bpp));
      /*TODO: possible efficiency improvement: if in this reduced image the bits fit nicely in 1 scanline,
      move bytes instead of bits or move not at all*/
      if(bpp < 8)
      {
        /*remove padding bits in scanlines; after this there still may be padding
        bits between the different reduced images: each reduced image still starts nicely at a byte*/
        removePaddingBits(&in[passstart[i]], &in[padded_passstart[i]], passw[i] * bpp,
                          ((passw[i] * bpp + 7) / 8) * 8, passh[i]);
      }
    }

    Adam7_deinterlace(out, in, w, h, bpp);
  }

  return 0;
}